

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

CommissionerDataset * __thiscall
ot::commissioner::CommissionerApp::MakeDefaultCommissionerDataset
          (CommissionerDataset *__return_storage_ptr__,CommissionerApp *this)

{
  bool bVar1;
  CommissionerApp *this_local;
  CommissionerDataset *dataset;
  
  CommissionerDataset::CommissionerDataset(__return_storage_ptr__);
  __return_storage_ptr__->mJoinerUdpPort = 1000;
  *(byte *)((long)&__return_storage_ptr__->mPresentFlags + 1) =
       *(byte *)((long)&__return_storage_ptr__->mPresentFlags + 1) | 4;
  bVar1 = IsCcmMode(this);
  if (bVar1) {
    __return_storage_ptr__->mAeUdpPort = 0x3e9;
    __return_storage_ptr__->mPresentFlags = __return_storage_ptr__->mPresentFlags | 0x200;
    __return_storage_ptr__->mNmkpUdpPort = 0x3ea;
    __return_storage_ptr__->mPresentFlags = __return_storage_ptr__->mPresentFlags | 0x100;
  }
  return __return_storage_ptr__;
}

Assistant:

CommissionerDataset CommissionerApp::MakeDefaultCommissionerDataset() const
{
    CommissionerDataset dataset;

    dataset.mJoinerUdpPort = kDefaultJoinerUdpPort;
    dataset.mPresentFlags |= CommissionerDataset::kJoinerUdpPortBit;

    if (IsCcmMode())
    {
        dataset.mAeUdpPort = kDefaultAeUdpPort;
        dataset.mPresentFlags |= CommissionerDataset::kAeUdpPortBit;
        dataset.mNmkpUdpPort = kDefaultNmkpUdpPort;
        dataset.mPresentFlags |= CommissionerDataset::kNmkpUdpPortBit;
    }

    return dataset;
}